

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent_coop.cpp
# Opt level: O2

void __thiscall
so_5::coop_t::do_add_agent
          (coop_t *this,agent_ref_t *agent_ref,disp_binder_unique_ptr_t *disp_binder)

{
  disp_binder_t *__p;
  exception_t *this_00;
  allocator local_51;
  disp_binder_ref_t dbinder;
  string local_40;
  
  __p = (disp_binder->_M_t).
        super___uniq_ptr_impl<so_5::disp_binder_t,_std::default_delete<so_5::disp_binder_t>_>._M_t.
        super__Tuple_impl<0UL,_so_5::disp_binder_t_*,_std::default_delete<so_5::disp_binder_t>_>.
        super__Head_base<0UL,_so_5::disp_binder_t_*,_false>._M_head_impl;
  (disp_binder->_M_t).
  super___uniq_ptr_impl<so_5::disp_binder_t,_std::default_delete<so_5::disp_binder_t>_>._M_t.
  super__Tuple_impl<0UL,_so_5::disp_binder_t_*,_std::default_delete<so_5::disp_binder_t>_>.
  super__Head_base<0UL,_so_5::disp_binder_t_*,_false>._M_head_impl = (disp_binder_t *)0x0;
  std::__shared_ptr<so_5::disp_binder_t,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<so_5::disp_binder_t,void>
            ((__shared_ptr<so_5::disp_binder_t,(__gnu_cxx::_Lock_policy)2> *)&dbinder,__p);
  if ((dbinder.super___shared_ptr<so_5::disp_binder_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)0x0) && (agent_ref->m_obj != (agent_t *)0x0)) {
    agent_with_disp_binder_t::agent_with_disp_binder_t
              ((agent_with_disp_binder_t *)&local_40,agent_ref,&dbinder);
    std::
    vector<so_5::coop_t::agent_with_disp_binder_t,_std::allocator<so_5::coop_t::agent_with_disp_binder_t>_>
    ::emplace_back<so_5::coop_t::agent_with_disp_binder_t>
              (&this->m_agent_array,(agent_with_disp_binder_t *)&local_40);
    agent_with_disp_binder_t::~agent_with_disp_binder_t((agent_with_disp_binder_t *)&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&dbinder.super___shared_ptr<so_5::disp_binder_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return;
  }
  this_00 = (exception_t *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string((string *)&local_40,"zero ptr to agent or disp binder",&local_51);
  exception_t::exception_t(this_00,&local_40,0x16);
  __cxa_throw(this_00,&exception_t::typeinfo,exception_t::~exception_t);
}

Assistant:

void
coop_t::do_add_agent(
	const agent_ref_t & agent_ref,
	disp_binder_unique_ptr_t disp_binder )
{
	disp_binder_ref_t dbinder( disp_binder.release() );

	if( nullptr == dbinder.get() || nullptr == agent_ref.get() )
		throw exception_t(
			"zero ptr to agent or disp binder",
			rc_coop_has_references_to_null_agents_or_binders );

	m_agent_array.push_back(
		agent_with_disp_binder_t( agent_ref, dbinder ) );
}